

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::AppendSuccessInformation(cmFindPackageCommand *this)

{
  bool bVar1;
  bool found_00;
  cmState *pcVar2;
  char *pcVar3;
  char *val;
  string found;
  string upperFound;
  string versionInfo;
  string versionInfoPropName;
  string requiredInfoPropName;
  string quietInfoPropName;
  allocator local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  undefined8 local_90;
  char local_88 [16];
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_d8,"_CMAKE_",(allocator *)&local_b8);
  std::operator+(&local_b8,&this->Name,"_TRANSITIVE_DEPENDENCY");
  std::__cxx11::string::append((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  pcVar2 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  cmState::SetGlobalProperty(pcVar2,&local_d8,"False");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,(string *)&this->Name);
  std::__cxx11::string::append((char *)&local_d8);
  cmsys::SystemTools::UpperCase(&local_b8,&local_d8);
  pcVar3 = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_b8);
  val = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_d8);
  bVar1 = cmSystemTools::IsOn(val);
  found_00 = true;
  if (!bVar1) {
    found_00 = cmSystemTools::IsOn(pcVar3);
  }
  AppendToFoundProperty(this,found_00);
  std::__cxx11::string::string((string *)&local_38,"_CMAKE_",(allocator *)&local_78);
  std::__cxx11::string::append((string *)&local_38);
  std::__cxx11::string::append((char *)&local_38);
  pcVar2 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  pcVar3 = "FALSE";
  if (this->Quiet != false) {
    pcVar3 = "TRUE";
  }
  cmState::SetGlobalProperty(pcVar2,&local_38,pcVar3);
  std::__cxx11::string::string((string *)&local_78,"_CMAKE_",(allocator *)&local_98);
  std::__cxx11::string::append((string *)&local_78);
  std::__cxx11::string::append((char *)&local_78);
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = '\0';
  if ((this->Version)._M_string_length != 0) {
    std::__cxx11::string::assign((char *)&local_98);
    std::__cxx11::string::append((char *)&local_98);
    std::__cxx11::string::append((string *)&local_98);
  }
  pcVar2 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
  cmState::SetGlobalProperty(pcVar2,&local_78,local_98);
  if (this->Required == true) {
    std::__cxx11::string::string((string *)&local_58,"_CMAKE_",&local_d9);
    std::__cxx11::string::append((string *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    pcVar2 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    cmState::SetGlobalProperty(pcVar2,&local_58,"REQUIRED");
    std::__cxx11::string::~string((string *)&local_58);
  }
  RestoreFindDefinitions(this);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&((this->super_cmFindCommon).super_cmCommand.Makefile)->FindPackageModuleStack);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void cmFindPackageCommand::AppendSuccessInformation()
{
  {
    std::string transitivePropName = "_CMAKE_";
    transitivePropName += this->Name + "_TRANSITIVE_DEPENDENCY";
    this->Makefile->GetState()->SetGlobalProperty(transitivePropName, "False");
  }
  std::string found = this->Name;
  found += "_FOUND";
  std::string upperFound = cmSystemTools::UpperCase(found);

  const char* upperResult = this->Makefile->GetDefinition(upperFound);
  const char* result = this->Makefile->GetDefinition(found);
  bool packageFound =
    ((cmSystemTools::IsOn(result)) || (cmSystemTools::IsOn(upperResult)));

  this->AppendToFoundProperty(packageFound);

  // Record whether the find was quiet or not, so this can be used
  // e.g. in FeatureSummary.cmake
  std::string quietInfoPropName = "_CMAKE_";
  quietInfoPropName += this->Name;
  quietInfoPropName += "_QUIET";
  this->Makefile->GetState()->SetGlobalProperty(
    quietInfoPropName, this->Quiet ? "TRUE" : "FALSE");

  // set a global property to record the required version of this package
  std::string versionInfoPropName = "_CMAKE_";
  versionInfoPropName += this->Name;
  versionInfoPropName += "_REQUIRED_VERSION";
  std::string versionInfo;
  if (!this->Version.empty()) {
    versionInfo = this->VersionExact ? "==" : ">=";
    versionInfo += " ";
    versionInfo += this->Version;
  }
  this->Makefile->GetState()->SetGlobalProperty(versionInfoPropName,
                                                versionInfo.c_str());
  if (this->Required) {
    std::string requiredInfoPropName = "_CMAKE_";
    requiredInfoPropName += this->Name;
    requiredInfoPropName += "_TYPE";
    this->Makefile->GetState()->SetGlobalProperty(requiredInfoPropName,
                                                  "REQUIRED");
  }

  // Restore original state of "_FIND_" variables we set.
  this->RestoreFindDefinitions();

  // Pop the package stack
  this->Makefile->FindPackageModuleStack.pop_back();
}